

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcPlateType::IfcPlateType(IfcPlateType *this)

{
  IfcPlateType *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x1c0,"IfcPlateType");
  IfcBuildingElementType::IfcBuildingElementType
            ((IfcBuildingElementType *)this,&PTR_construction_vtable_24__00f5da10);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcPlateType,_1UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPlateType,_1UL>,
             &PTR_construction_vtable_24__00f5db48);
  *(undefined8 *)this = 0xf5d8e0;
  *(undefined8 *)&this->field_0x1c0 = 0xf5d9f8;
  *(undefined8 *)&this->field_0x88 = 0xf5d908;
  *(undefined8 *)&this->field_0x98 = 0xf5d930;
  *(undefined8 *)&this->field_0xf0 = 0xf5d958;
  *(undefined8 *)&this->field_0x148 = 0xf5d980;
  *(undefined8 *)&this->field_0x180 = 0xf5d9a8;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPlateType,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0xf5d9d0;
  std::__cxx11::string::string
            ((string *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPlateType,_1UL>).field_0x10);
  return;
}

Assistant:

IfcPlateType() : Object("IfcPlateType") {}